

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::VerifyAssignmentVisitor::check_var(Var *var)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long *plVar3;
  long *plVar4;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  long *plVar5;
  string_view format_str;
  format_args args;
  const_iterator local_a0;
  const_iterator local_98;
  undefined8 uStack_90;
  string local_88;
  Stmt **local_68;
  undefined8 uStack_60;
  undefined1 auStack_48 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  plVar5 = (long *)(CONCAT44(extraout_var,iVar1) + 0x10);
  plVar3 = plVar5;
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) {
      return;
    }
    lVar2 = (**(code **)(*(long *)plVar3[1] + 0x20))();
    plVar4 = plVar5;
  } while (*(int *)(lVar2 + 0x48) != 0);
  do {
    plVar4 = (long *)*plVar4;
    if (plVar4 == (long *)0x0) {
      return;
    }
    lVar2 = (**(code **)(*(long *)plVar4[1] + 0x20))();
  } while (*(int *)(lVar2 + 0x48) == 0);
  auStack_48 = (undefined1  [8])0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
            ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_48,
             *(size_type *)(CONCAT44(extraout_var,iVar1) + 0x18));
  plVar5 = (long *)*plVar5;
  if (plVar5 != (long *)0x0) {
    do {
      local_88._M_dataplus._M_p = (pointer)plVar5[1];
      std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*>
                ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_48,
                 (AssignStmt **)&local_88);
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_68,var);
  local_98._M_current = local_68;
  uStack_90 = uStack_60;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x38;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_88,(detail *)"{0} has wire assignment yet is also used in always block",
             format_str,args);
  local_98._M_current = (Stmt **)auStack_48;
  local_a0._M_current =
       stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  StmtException::StmtException(this,&local_88,&local_98,&local_a0);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void inline static check_var(Var* var) {
        bool is_top_level = false;
        auto const& sources = var->sources();
        for (auto const& stmt : sources) {
            if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                is_top_level = true;
                break;
            }
        }

        // second pass the check all the assignments
        bool has_error = false;
        if (is_top_level) {
            for (auto const& stmt : sources) {
                if (stmt->parent()->ir_node_kind() != IRNodeKind::GeneratorKind) {
                    has_error = true;
                    break;
                }
            }
        }

        if (has_error) {
            std::vector<Stmt*> stmt_list;
            stmt_list.reserve(sources.size());
            // prepare the error
            for (auto const& stmt : sources) {
                stmt_list.emplace_back(stmt.get());
            }
            throw StmtException(::format("{0} has wire assignment yet is also used in always block",
                                         var->to_string()),
                                stmt_list.begin(), stmt_list.end());
        }
    }